

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImRect ImGui::ShowMetricsWindow::Funcs::GetWindowRect(ImGuiWindow *window,int rect_type)

{
  int in_ESI;
  long in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar8 [56];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar10 [56];
  ImRect IVar11;
  ImVec2 min_1;
  ImVec2 min;
  ImVec2 *in_stack_ffffffffffffffa8;
  ImVec2 local_4c;
  undefined8 local_44;
  ImVec2 local_3c;
  ImVec2 local_34;
  undefined8 local_2c;
  ImVec2 local_24 [2];
  ImRect local_10;
  undefined1 auVar1 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 auVar9 [64];
  
  auVar10 = in_ZMM1._8_56_;
  auVar8 = in_ZMM0._8_56_;
  if (in_ESI == 0) {
    IVar11 = ImGuiWindow::Rect((ImGuiWindow *)0x1d18ee);
    auVar9._0_8_ = IVar11.Max;
    auVar9._8_56_ = auVar10;
    auVar1._0_8_ = IVar11.Min;
    auVar1._8_56_ = auVar8;
    local_10.Min = (ImVec2)vmovlpd_avx(auVar1._0_16_);
    local_10.Max = (ImVec2)vmovlpd_avx(auVar9._0_16_);
  }
  else if (in_ESI == 1) {
    local_10.Min = *(ImVec2 *)(in_RDI + 0x208);
    local_10.Max = *(ImVec2 *)(in_RDI + 0x210);
  }
  else if (in_ESI == 2) {
    local_10.Min = *(ImVec2 *)(in_RDI + 0x218);
    local_10.Max = *(ImVec2 *)(in_RDI + 0x220);
  }
  else if (in_ESI == 3) {
    local_10.Min = *(ImVec2 *)(in_RDI + 0x228);
    local_10.Max = *(ImVec2 *)(in_RDI + 0x230);
  }
  else if (in_ESI == 4) {
    local_10.Min = *(ImVec2 *)(in_RDI + 0x238);
    local_10.Max = *(ImVec2 *)(in_RDI + 0x240);
  }
  else if (in_ESI == 5) {
    auVar2._0_8_ = ::operator-(in_stack_ffffffffffffffa8,(ImVec2 *)0x1d19c2);
    auVar2._8_56_ = extraout_var;
    local_2c = vmovlpd_avx(auVar2._0_16_);
    auVar3._0_8_ = ::operator+(in_stack_ffffffffffffffa8,(ImVec2 *)0x1d19db);
    auVar3._8_56_ = extraout_var_00;
    local_24[0] = (ImVec2)vmovlpd_avx(auVar3._0_16_);
    auVar4._0_8_ = ::operator+(in_stack_ffffffffffffffa8,(ImVec2 *)0x1d19f4);
    auVar4._8_56_ = extraout_var_01;
    local_34 = (ImVec2)vmovlpd_avx(auVar4._0_16_);
    ImRect::ImRect(&local_10,local_24,&local_34);
  }
  else if (in_ESI == 6) {
    auVar5._0_8_ = ::operator-(in_stack_ffffffffffffffa8,(ImVec2 *)0x1d1a32);
    auVar5._8_56_ = extraout_var_02;
    local_44 = vmovlpd_avx(auVar5._0_16_);
    auVar6._0_8_ = ::operator+(in_stack_ffffffffffffffa8,(ImVec2 *)0x1d1a4b);
    auVar6._8_56_ = extraout_var_03;
    local_3c = (ImVec2)vmovlpd_avx(auVar6._0_16_);
    auVar7._0_8_ = ::operator+(in_stack_ffffffffffffffa8,(ImVec2 *)0x1d1a64);
    auVar7._8_56_ = extraout_var_04;
    local_4c = (ImVec2)vmovlpd_avx(auVar7._0_16_);
    ImRect::ImRect(&local_10,&local_3c,&local_4c);
  }
  else {
    if (in_ESI != 7) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x2a32,
                    "static ImRect ImGui::ShowMetricsWindow(bool *)::Funcs::GetWindowRect(ImGuiWindow *, int)"
                   );
    }
    local_10.Min = *(ImVec2 *)(in_RDI + 0x268);
    local_10.Max = *(ImVec2 *)(in_RDI + 0x270);
  }
  IVar11.Max = local_10.Max;
  IVar11.Min = local_10.Min;
  return IVar11;
}

Assistant:

static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)       { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentIdeal)         { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSizeIdeal); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }